

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btSimpleDynamicsWorld.cpp
# Opt level: O2

int __thiscall
btSimpleDynamicsWorld::stepSimulation
          (btSimpleDynamicsWorld *this,btScalar timeStep,int maxSubSteps,btScalar fixedTimeStep)

{
  int iVar1;
  uint uVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined8 local_78;
  undefined4 local_70;
  btScalar local_6c;
  undefined8 local_68;
  undefined8 local_60;
  undefined8 uStack_58;
  undefined8 local_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined4 local_30;
  undefined8 local_2c;
  
  predictUnconstraintMotion(this,timeStep);
  (this->super_btDynamicsWorld).super_btCollisionWorld.m_dispatchInfo.m_timeStep = timeStep;
  (this->super_btDynamicsWorld).super_btCollisionWorld.m_dispatchInfo.m_stepCount = 0;
  iVar1 = (*(this->super_btDynamicsWorld).super_btCollisionWorld._vptr_btCollisionWorld[5])(this);
  (this->super_btDynamicsWorld).super_btCollisionWorld.m_dispatchInfo.m_debugDraw =
       (btIDebugDraw *)CONCAT44(extraout_var,iVar1);
  (*(this->super_btDynamicsWorld).super_btCollisionWorld._vptr_btCollisionWorld[0xb])(this);
  uVar2 = (*((this->super_btDynamicsWorld).super_btCollisionWorld.m_dispatcher1)->_vptr_btDispatcher
            [9])();
  if (uVar2 != 0) {
    iVar1 = (*((this->super_btDynamicsWorld).super_btCollisionWorld.m_dispatcher1)->
              _vptr_btDispatcher[0xb])();
    local_78 = 0x3f8000003f19999a;
    local_70 = 0x3e99999a;
    local_68 = 0xa00000000;
    local_50 = 0x100000000;
    local_60 = 0x3f80000041a00000;
    uStack_58 = 0x3f4ccccd3e4ccccd;
    local_48 = 0x3dcccccdbd23d70a;
    uStack_40 = 0x3f59999a00000000;
    local_38 = 0x200000104;
    local_30 = 0x80;
    local_2c = 0x7149f2ca42c80000;
    local_6c = timeStep;
    (*this->m_constraintSolver->_vptr_btConstraintSolver[2])
              (this->m_constraintSolver,0,(ulong)uVar2);
    (*this->m_constraintSolver->_vptr_btConstraintSolver[3])
              (this->m_constraintSolver,
               (this->super_btDynamicsWorld).super_btCollisionWorld.m_collisionObjects.m_data,
               (ulong)(uint)(this->super_btDynamicsWorld).super_btCollisionWorld.m_collisionObjects.
                            m_size,CONCAT44(extraout_var_00,iVar1),(ulong)uVar2,0,0,&local_78,
               (this->super_btDynamicsWorld).super_btCollisionWorld.m_debugDrawer,
               (this->super_btDynamicsWorld).super_btCollisionWorld.m_dispatcher1);
    (*this->m_constraintSolver->_vptr_btConstraintSolver[4])
              (this->m_constraintSolver,&local_78,
               (this->super_btDynamicsWorld).super_btCollisionWorld.m_debugDrawer);
  }
  integrateTransforms(this,timeStep);
  (*(this->super_btDynamicsWorld).super_btCollisionWorld._vptr_btCollisionWorld[2])(this);
  (*(this->super_btDynamicsWorld).super_btCollisionWorld._vptr_btCollisionWorld[0x14])(this);
  (*(this->super_btDynamicsWorld).super_btCollisionWorld._vptr_btCollisionWorld[0x1e])(this);
  return 1;
}

Assistant:

int		btSimpleDynamicsWorld::stepSimulation( btScalar timeStep,int maxSubSteps, btScalar fixedTimeStep)
{
	(void)fixedTimeStep;
	(void)maxSubSteps;


	///apply gravity, predict motion
	predictUnconstraintMotion(timeStep);

	btDispatcherInfo&	dispatchInfo = getDispatchInfo();
	dispatchInfo.m_timeStep = timeStep;
	dispatchInfo.m_stepCount = 0;
	dispatchInfo.m_debugDraw = getDebugDrawer();

	///perform collision detection
	performDiscreteCollisionDetection();

	///solve contact constraints
	int numManifolds = m_dispatcher1->getNumManifolds();
	if (numManifolds)
	{
		btPersistentManifold** manifoldPtr = ((btCollisionDispatcher*)m_dispatcher1)->getInternalManifoldPointer();
		
		btContactSolverInfo infoGlobal;
		infoGlobal.m_timeStep = timeStep;
		m_constraintSolver->prepareSolve(0,numManifolds);
		m_constraintSolver->solveGroup(&getCollisionObjectArray()[0],getNumCollisionObjects(),manifoldPtr, numManifolds,0,0,infoGlobal,m_debugDrawer, m_dispatcher1);
		m_constraintSolver->allSolved(infoGlobal,m_debugDrawer);
	}

	///integrate transforms
	integrateTransforms(timeStep);
		
	updateAabbs();

	synchronizeMotionStates();

	clearForces();

	return 1;

}